

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O1

word Extra_Truth6MinimumRoundMany1(word t,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  word t_00;
  word wVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  char pCanonPerm1 [16];
  uint local_54;
  word local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_54 = *pCanonPhase;
  wVar2 = t;
  switch(local_54 >> 7) {
  case 0:
    do {
      iVar4 = *pStore;
      lVar5 = 0;
      wVar2 = t;
      do {
        iVar1 = pStore[lVar5 + 1];
        if (iVar4 == pStore[lVar5 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne_noEBFC(wVar2,(int)lVar5,pCanonPerm,pCanonPhase);
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      bVar6 = t != wVar2;
      t = wVar2;
    } while (bVar6);
    break;
  case 1:
    do {
      iVar4 = *pStore;
      lVar5 = 0;
      wVar2 = t;
      do {
        iVar1 = pStore[lVar5 + 1];
        if (iVar4 == pStore[lVar5 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne(wVar2,(int)lVar5,pCanonPerm,pCanonPhase);
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      bVar6 = t != wVar2;
      t = wVar2;
    } while (bVar6);
    break;
  case 2:
    local_54 = local_54 ^ 0x40;
    local_48 = *(undefined8 *)pCanonPerm;
    uStack_40 = *(undefined8 *)(pCanonPerm + 8);
    do {
      iVar4 = *pStore;
      lVar5 = 0;
      local_50 = wVar2;
      do {
        iVar1 = pStore[lVar5 + 1];
        if (iVar4 == pStore[lVar5 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne_noEBFC(wVar2,(int)lVar5,pCanonPerm,pCanonPhase);
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
    } while (local_50 != wVar2);
    uVar3 = ~t;
    do {
      iVar4 = *pStore;
      lVar5 = 0;
      t_00 = uVar3;
      do {
        iVar1 = pStore[lVar5 + 1];
        if (iVar4 == pStore[lVar5 + 1]) {
          t_00 = Extra_Truth6MinimumRoundOne_noEBFC(t_00,(int)lVar5,(char *)&local_48,&local_54);
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      bVar6 = uVar3 != t_00;
      uVar3 = t_00;
    } while (bVar6);
    goto LAB_005630dc;
  case 3:
    local_54 = local_54 ^ 0x40;
    local_48 = *(undefined8 *)pCanonPerm;
    uStack_40 = *(undefined8 *)(pCanonPerm + 8);
    do {
      iVar4 = *pStore;
      lVar5 = 0;
      local_50 = wVar2;
      do {
        iVar1 = pStore[lVar5 + 1];
        if (iVar4 == pStore[lVar5 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne(wVar2,(int)lVar5,pCanonPerm,pCanonPhase);
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
    } while (local_50 != wVar2);
    uVar3 = ~t;
    do {
      iVar4 = *pStore;
      lVar5 = 0;
      t_00 = uVar3;
      do {
        iVar1 = pStore[lVar5 + 1];
        if (iVar4 == pStore[lVar5 + 1]) {
          t_00 = Extra_Truth6MinimumRoundOne(t_00,(int)lVar5,(char *)&local_48,&local_54);
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      bVar6 = uVar3 != t_00;
      uVar3 = t_00;
    } while (bVar6);
LAB_005630dc:
    if (t_00 < wVar2) {
      *pCanonPhase = local_54;
      *(undefined8 *)pCanonPerm = local_48;
      *(undefined8 *)(pCanonPerm + 8) = uStack_40;
      wVar2 = t_00;
    }
    break;
  default:
    do {
      iVar4 = *pStore;
      lVar5 = 0;
      wVar2 = t;
      do {
        iVar1 = pStore[lVar5 + 1];
        if (iVar4 == pStore[lVar5 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne(wVar2,(int)lVar5,pCanonPerm,pCanonPhase);
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      bVar6 = t != wVar2;
      t = wVar2;
    } while (bVar6);
  }
  return wVar2;
}

Assistant:

word Extra_Truth6MinimumRoundMany1( word t, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    word tMin0, tMin=t;
    char pCanonPerm1[16];
    unsigned uCanonPhase1;
    switch ((* pCanonPhase) >> 7)
    {
    case 0 :
        {

    	    return Extra_Truth6MinimumRoundMany_noEBFC( t, pStore, pCanonPerm, pCanonPhase);
        }
    case 1 :
        {            
            return Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
        }
    case 2 :
        { 
            uCanonPhase1 = *pCanonPhase;
            uCanonPhase1 ^= (1 << 6);
            memcpy(pCanonPerm1,pCanonPerm,sizeof(char)*16);
            tMin0 = Extra_Truth6MinimumRoundMany_noEBFC( t, pStore, pCanonPerm, pCanonPhase);
            tMin =  Extra_Truth6MinimumRoundMany_noEBFC( ~t, pStore, pCanonPerm1, &uCanonPhase1);
            if(tMin0 <=tMin)
                return tMin0;
            else
            {
                *pCanonPhase = uCanonPhase1;
                memcpy(pCanonPerm,pCanonPerm1,sizeof(char)*16);
                return tMin;
            }
        }
    case 3 :
        {
            uCanonPhase1 = *pCanonPhase;
            uCanonPhase1 ^= (1 << 6);
            memcpy(pCanonPerm1,pCanonPerm,sizeof(char)*16);
            tMin0 = Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
            tMin =  Extra_Truth6MinimumRoundMany( ~t, pStore, pCanonPerm1, &uCanonPhase1);
            if(tMin0 <=tMin)
                return tMin0;
            else
            {
                *pCanonPhase = uCanonPhase1;
                memcpy(pCanonPerm,pCanonPerm1,sizeof(char)*16);
                return tMin;
            }
        }
    }
    return Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
}